

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
MergeFromInnerLoop<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
          (RepeatedPtrFieldBase *this,void **our_elems,void **other_elems,int length,
          int already_allocated)

{
  LayerParameter *from;
  Arena *arena_00;
  LayerParameter *to;
  Type *new_elem_1;
  Type *other_elem_1;
  int i_1;
  Arena *arena;
  Type *new_elem;
  Type *other_elem;
  int i;
  int already_allocated_local;
  int length_local;
  void **other_elems_local;
  void **our_elems_local;
  RepeatedPtrFieldBase *this_local;
  
  for (other_elem._4_4_ = 0; other_elem._4_4_ < already_allocated && other_elem._4_4_ < length;
      other_elem._4_4_ = other_elem._4_4_ + 1) {
    GenericTypeHandler<caffe::LayerParameter>::Merge
              ((LayerParameter *)other_elems[other_elem._4_4_],
               (LayerParameter *)our_elems[other_elem._4_4_]);
  }
  arena_00 = GetArenaNoVirtual(this);
  for (other_elem_1._4_4_ = already_allocated; other_elem_1._4_4_ < length;
      other_elem_1._4_4_ = other_elem_1._4_4_ + 1) {
    from = (LayerParameter *)other_elems[other_elem_1._4_4_];
    to = GenericTypeHandler<caffe::LayerParameter>::NewFromPrototype(from,arena_00);
    GenericTypeHandler<caffe::LayerParameter>::Merge(from,to);
    our_elems[other_elem_1._4_4_] = to;
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::MergeFromInnerLoop(
    void** our_elems, void** other_elems, int length, int already_allocated) {
  // Split into two loops, over ranges [0, allocated) and [allocated, length),
  // to avoid a branch within the loop.
  for (int i = 0; i < already_allocated && i < length; i++) {
    // Already allocated: use existing element.
    typename TypeHandler::Type* other_elem =
        reinterpret_cast<typename TypeHandler::Type*>(other_elems[i]);
    typename TypeHandler::Type* new_elem =
        reinterpret_cast<typename TypeHandler::Type*>(our_elems[i]);
    TypeHandler::Merge(*other_elem, new_elem);
  }
  Arena* arena = GetArenaNoVirtual();
  for (int i = already_allocated; i < length; i++) {
    // Not allocated: alloc a new element first, then merge it.
    typename TypeHandler::Type* other_elem =
        reinterpret_cast<typename TypeHandler::Type*>(other_elems[i]);
    typename TypeHandler::Type* new_elem =
        TypeHandler::NewFromPrototype(other_elem, arena);
    TypeHandler::Merge(*other_elem, new_elem);
    our_elems[i] = new_elem;
  }
}